

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *data;
  conncache *h;
  size_t sVar1;
  long lVar2;
  connectbundle *p;
  size_t key_len;
  void *pvVar3;
  size_t len;
  CURLcode CVar4;
  char key [128];
  char acStack_b8 [136];
  
  data = conn->data;
  p = Curl_conncache_find_bundle(conn,(data->state).conn_cache);
  if (p == (connectbundle *)0x0) {
    p = (connectbundle *)(*Curl_cmalloc)(0x30);
    if (p != (connectbundle *)0x0) {
      p->num_connections = 0;
      p->multiuse = 0;
      Curl_llist_init(&p->conn_list,conn_llist_dtor);
      hashkey(conn,acStack_b8,len);
      h = (data->state).conn_cache;
      key_len = strlen(acStack_b8);
      pvVar3 = Curl_hash_add(&h->hash,acStack_b8,key_len,p);
      if (pvVar3 != (void *)0x0) goto LAB_004191ef;
      Curl_llist_destroy(&p->conn_list,(void *)0x0);
      (*Curl_cfree)(p);
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
LAB_004191ef:
    Curl_llist_insert_next(&p->conn_list,(p->conn_list).tail,conn,&conn->bundle_node);
    conn->bundle = p;
    p->num_connections = p->num_connections + 1;
    sVar1 = connc->num_conn;
    lVar2 = connc->next_connection_id;
    conn->connection_id = lVar2;
    connc->num_conn = sVar1 + 1;
    connc->next_connection_id = lVar2 + 1;
    CVar4 = CURLE_OK;
  }
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct Curl_easy *data = conn->data;

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);
  if(!bundle) {
    int rc;
    char key[128];

    result = bundle_create(data, &new_bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key));
    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);

    if(!rc) {
      bundle_destroy(new_bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
    bundle = new_bundle;
  }

  bundle_add_conn(bundle, conn);
  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %zu members\n",
               conn->connection_id, connc->num_conn));

  unlock:
  CONN_UNLOCK(data);

  return result;
}